

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Transport.cpp
# Opt level: O0

void __thiscall
adios2::Transport::Transport(Transport *this,string *type,string *library,Comm *comm)

{
  undefined8 in_RCX;
  string *in_RDX;
  string *in_RSI;
  IOChrono *in_RDI;
  
  (in_RDI->m_Timers)._M_h._M_buckets = (__buckets_ptr)&PTR__Transport_01135068;
  std::__cxx11::string::string((string *)&(in_RDI->m_Timers)._M_h._M_bucket_count,in_RSI);
  std::__cxx11::string::string
            ((string *)&(in_RDI->m_Timers)._M_h._M_rehash_policy._M_next_resize,in_RDX);
  std::__cxx11::string::string((string *)&(in_RDI->m_Bytes)._M_h._M_before_begin);
  *(undefined4 *)&(in_RDI->m_Bytes)._M_h._M_single_bucket = 0;
  *(undefined1 *)((long)&(in_RDI->m_Bytes)._M_h._M_single_bucket + 4) = 0;
  *(undefined8 *)&in_RDI->m_IsActive = in_RCX;
  profiling::IOChrono::IOChrono(in_RDI);
  return;
}

Assistant:

Transport::Transport(const std::string type, const std::string library, helper::Comm const &comm)
: m_Type(type), m_Library(library), m_Comm(comm)
{
}